

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O0

LongReadsMapper * __thiscall
LongReadsMapper::operator=(LongReadsMapper *this,LongReadsMapper *other)

{
  runtime_error *this_00;
  LongReadsMapper *in_RSI;
  LongReadsMapper *in_RDI;
  LongReadsMapper *in_stack_00000050;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *in_stack_00000068;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *in_stack_00000070;
  
  if (in_RSI != in_RDI) {
    if ((in_RDI->sg != in_RSI->sg) && (in_RDI->datastore != in_RSI->datastore)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,
                 "Can only LongReadsMappers from the same SequenceDistanceGraph and LongReadsDatastore"
                );
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    in_RDI->sat_kmer_index = (bool)(in_RSI->sat_kmer_index & 1);
    in_RDI->k = in_RSI->k;
    std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::operator=
              (in_stack_00000070,in_stack_00000068);
    update_indexes(in_stack_00000050);
  }
  return in_RDI;
}

Assistant:

LongReadsMapper& LongReadsMapper::operator=(const LongReadsMapper &other) {
    if (&other == this) {
        return *this;
    }
    if (&sg != &other.sg and &datastore != &other.datastore) { throw std::runtime_error("Can only LongReadsMappers from the same SequenceDistanceGraph and LongReadsDatastore"); }
    sat_kmer_index = other.sat_kmer_index;
    k = other.k;
    mappings = other.mappings;
    update_indexes();
    return *this;
}